

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

EGLConfig deqp::egl::anon_unknown_0::getEGLConfig
                    (Library *egl,EGLDisplay eglDisplay,SurfaceType surfaceType,bool preserveBuffer)

{
  EGLConfig pvVar1;
  code *filter;
  FilterList filters;
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (surfaceType == SURFACETYPE_PBUFFER) {
    filter = isPbuffer;
  }
  else {
    if (surfaceType != SURFACETYPE_WINDOW) goto LAB_00e04690;
    filter = isWindow;
  }
  eglu::FilterList::operator<<((FilterList *)&local_38,filter);
LAB_00e04690:
  eglu::FilterList::operator<<((FilterList *)&local_38,isES2Renderable);
  if (preserveBuffer) {
    eglu::FilterList::operator<<((FilterList *)&local_38,hasPreserveSwap);
  }
  pvVar1 = eglu::chooseSingleConfig(egl,eglDisplay,(FilterList *)&local_38);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base(&local_38);
  return pvVar1;
}

Assistant:

EGLConfig getEGLConfig (const Library& egl, EGLDisplay eglDisplay, NegativePartialUpdateTest::SurfaceType surfaceType, bool preserveBuffer)
{
	FilterList filters;
	if (surfaceType == NegativePartialUpdateTest::SURFACETYPE_WINDOW)
		filters << isWindow;
	else if (surfaceType == NegativePartialUpdateTest::SURFACETYPE_PBUFFER)
		filters << isPbuffer;
	else
		DE_FATAL("Invalid surfaceType");

	filters << isES2Renderable;

	if (preserveBuffer)
		filters << hasPreserveSwap;

	return chooseSingleConfig(egl, eglDisplay, filters);
}